

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::evalTexture2DArrayShadowGrad
               (ShaderEvalContext *c,TexLookupParams *param_2)

{
  float s;
  float t;
  float r;
  float lod;
  float fVar1;
  
  fVar1 = c->in[0].m_data[3];
  s = c->in[0].m_data[0];
  t = c->in[0].m_data[1];
  r = c->in[0].m_data[2];
  lod = computeLodFromGrad2DArray(c);
  fVar1 = texture2DArrayShadow(c,fVar1,s,t,r,lod);
  (c->color).m_data[0] = fVar1;
  return;
}

Assistant:

static void		evalTexture2DArrayShadowGrad	(ShaderEvalContext& c, const TexLookupParams&)		{ c.color.x() = texture2DArrayShadow(c, c.in[0].w(), c.in[0].x(), c.in[0].y(), c.in[0].z(), computeLodFromGrad2DArray(c)); }